

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Engine.cpp
# Opt level: O2

string * __thiscall
adios2::core::engine::BP5Engine::GetBPMetadataFileName
          (string *__return_storage_ptr__,BP5Engine *this,string *name)

{
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string bpName;
  
  helper::RemoveTrailingSlash(&bpName,name);
  std::operator+(&local_70,&bpName,'/');
  std::operator+(&local_50,&local_70,"md.");
  std::__cxx11::to_string(&local_90,0);
  std::operator+(__return_storage_ptr__,&local_50,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&bpName);
  return __return_storage_ptr__;
}

Assistant:

std::string BP5Engine::GetBPMetadataFileName(const std::string &name) const noexcept
{
    const std::string bpName = helper::RemoveTrailingSlash(name);
    const size_t index = 0; // global metadata file is generated by rank 0
    /* the name of the metadata file is "md.0" */
    const std::string bpMetaDataRankName(bpName + PathSeparator + "md." + std::to_string(index));
    return bpMetaDataRankName;
}